

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_generic.c
# Opt level: O0

void * tirpc_aligned(size_t alignment,size_t size,char *file,int line,char *function)

{
  void *pvVar1;
  void *r;
  char *function_local;
  int line_local;
  char *file_local;
  size_t size_local;
  size_t alignment_local;
  
  pvVar1 = (void *)aligned_alloc(alignment,size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  __assert_fail("r != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_generic.c"
                ,0x69,"void *tirpc_aligned(size_t, size_t, const char *, int, const char *)");
}

Assistant:

static void *
tirpc_aligned(size_t alignment, size_t size, const char *file, int line,
	      const char *function)
{
	void *r;

#if defined(_ISOC11_SOURCE)
	r = aligned_alloc(alignment, size);
#else
	(void) posix_memalign(&r, alignment, size);
#endif
	assert(r != NULL);
	return r;
}